

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  undefined1 local_ffe;
  undefined1 local_ffd;
  undefined1 local_ffc;
  allocator local_ffb;
  allocator local_ffa;
  allocator local_ff9;
  allocator local_ff8;
  allocator local_ff7;
  allocator local_ff6;
  allocator local_ff5;
  allocator local_ff4;
  allocator local_ff3;
  allocator local_ff2;
  allocator local_ff1;
  allocator local_ff0;
  allocator local_fef;
  allocator local_fee;
  allocator local_fed;
  allocator local_fec;
  allocator local_feb;
  allocator local_fea;
  allocator local_fe9;
  allocator local_fe8;
  allocator local_fe7;
  allocator local_fe6;
  allocator local_fe5;
  allocator local_fe4;
  allocator local_fe3;
  allocator local_fe2;
  allocator local_fe1;
  allocator local_fe0;
  allocator local_fdf;
  allocator local_fde;
  allocator local_fdd;
  allocator local_fdc;
  allocator local_fdb;
  allocator local_fda;
  allocator local_fd9;
  allocator local_fd8;
  allocator local_fd7;
  allocator local_fd6;
  allocator local_fd5;
  allocator local_fd4;
  allocator local_fd3;
  allocator local_fd2;
  allocator local_fd1;
  allocator local_fd0;
  allocator local_fcf;
  allocator local_fce;
  allocator local_fcd;
  allocator local_fcc;
  allocator local_fcb;
  allocator local_fca;
  allocator local_fc9;
  allocator local_fc8;
  allocator local_fc7;
  allocator local_fc6;
  allocator local_fc5;
  allocator local_fc4;
  allocator local_fc3;
  allocator local_fc2;
  allocator local_fc1;
  allocator local_fc0;
  allocator local_fbf;
  allocator local_fbe;
  allocator local_fbd;
  allocator local_fbc;
  allocator local_fbb;
  allocator local_fba;
  allocator local_fb9;
  allocator local_fb8;
  allocator local_fb7;
  allocator local_fb6;
  allocator local_fb5;
  allocator local_fb4;
  allocator local_fb3;
  allocator local_fb2;
  allocator local_fb1;
  allocator local_fb0;
  allocator local_faf;
  allocator local_fae;
  allocator local_fad;
  allocator local_fac;
  allocator local_fab;
  allocator local_faa;
  allocator local_fa9;
  allocator local_fa8;
  allocator local_fa7;
  allocator local_fa6;
  allocator local_fa5;
  allocator local_fa4;
  allocator local_fa3;
  allocator local_fa2;
  allocator local_fa1;
  allocator local_fa0;
  allocator local_f9f;
  allocator local_f9e;
  allocator local_f9d;
  allocator local_f9c;
  allocator local_f9b;
  allocator local_f9a;
  allocator local_f99;
  allocator local_f98;
  allocator local_f97;
  allocator local_f96;
  allocator local_f95;
  allocator local_f94;
  allocator local_f93;
  allocator local_f92;
  allocator local_f91;
  allocator local_f90;
  allocator local_f8f;
  allocator local_f8e;
  allocator local_f8d;
  allocator local_f8c;
  allocator local_f8b;
  allocator local_f8a;
  allocator local_f89;
  allocator local_f88;
  allocator local_f87;
  allocator local_f86;
  allocator local_f85;
  allocator local_f84;
  allocator local_f83;
  allocator local_f82;
  allocator local_f81;
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      ::std::__cxx11::string::string(local_f80,"main",&local_f81);
      ::std::__cxx11::string::string(local_f60,"saturate",&local_f82);
      ::std::__cxx11::string::string(local_f40,"assert",&local_f83);
      ::std::__cxx11::string::string(local_f20,"fmin3",&local_f84);
      ::std::__cxx11::string::string(local_f00,"fmax3",&local_f85);
      ::std::__cxx11::string::string(local_ee0,"VARIABLE_TRACEPOINT",&local_f86);
      ::std::__cxx11::string::string(local_ec0,"STATIC_DATA_TRACEPOINT",&local_f87);
      ::std::__cxx11::string::string(local_ea0,"STATIC_DATA_TRACEPOINT_V",&local_f88);
      ::std::__cxx11::string::string(local_e80,"METAL_ALIGN",&local_f89);
      ::std::__cxx11::string::string(local_e60,"METAL_ASM",&local_f8a);
      ::std::__cxx11::string::string(local_e40,"METAL_CONST",&local_f8b);
      ::std::__cxx11::string::string(local_e20,"METAL_DEPRECATED",&local_f8c);
      ::std::__cxx11::string::string(local_e00,"METAL_ENABLE_IF",&local_f8d);
      ::std::__cxx11::string::string(local_de0,"METAL_FUNC",&local_f8e);
      ::std::__cxx11::string::string(local_dc0,"METAL_INTERNAL",&local_f8f);
      ::std::__cxx11::string::string(local_da0,"METAL_NON_NULL_RETURN",&local_f90);
      ::std::__cxx11::string::string(local_d80,"METAL_NORETURN",&local_f91);
      ::std::__cxx11::string::string(local_d60,"METAL_NOTHROW",&local_f92);
      ::std::__cxx11::string::string(local_d40,"METAL_PURE",&local_f93);
      ::std::__cxx11::string::string(local_d20,"METAL_UNAVAILABLE",&local_f94);
      ::std::__cxx11::string::string(local_d00,"METAL_IMPLICIT",&local_f95);
      ::std::__cxx11::string::string(local_ce0,"METAL_EXPLICIT",&local_f96);
      ::std::__cxx11::string::string(local_cc0,"METAL_CONST_ARG",&local_f97);
      ::std::__cxx11::string::string(local_ca0,"METAL_ARG_UNIFORM",&local_f98);
      ::std::__cxx11::string::string(local_c80,"METAL_ZERO_ARG",&local_f99);
      ::std::__cxx11::string::string(local_c60,"METAL_VALID_LOD_ARG",&local_f9a);
      ::std::__cxx11::string::string(local_c40,"METAL_VALID_LEVEL_ARG",&local_f9b);
      ::std::__cxx11::string::string(local_c20,"METAL_VALID_STORE_ORDER",&local_f9c);
      ::std::__cxx11::string::string(local_c00,"METAL_VALID_LOAD_ORDER",&local_f9d);
      ::std::__cxx11::string::string
                (local_be0,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_f9e);
      ::std::__cxx11::string::string
                (local_bc0,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_f9f);
      ::std::__cxx11::string::string(local_ba0,"METAL_VALID_RENDER_TARGET",&local_fa0);
      ::std::__cxx11::string::string(local_b80,"is_function_constant_defined",&local_fa1);
      ::std::__cxx11::string::string(local_b60,"CHAR_BIT",&local_fa2);
      ::std::__cxx11::string::string(local_b40,"SCHAR_MAX",&local_fa3);
      ::std::__cxx11::string::string(local_b20,"SCHAR_MIN",&local_fa4);
      ::std::__cxx11::string::string(local_b00,"UCHAR_MAX",&local_fa5);
      ::std::__cxx11::string::string(local_ae0,"CHAR_MAX",&local_fa6);
      ::std::__cxx11::string::string(local_ac0,"CHAR_MIN",&local_fa7);
      ::std::__cxx11::string::string(local_aa0,"USHRT_MAX",&local_fa8);
      ::std::__cxx11::string::string(local_a80,"SHRT_MAX",&local_fa9);
      ::std::__cxx11::string::string(local_a60,"SHRT_MIN",&local_faa);
      ::std::__cxx11::string::string(local_a40,"UINT_MAX",&local_fab);
      ::std::__cxx11::string::string(local_a20,"INT_MAX",&local_fac);
      ::std::__cxx11::string::string(local_a00,"INT_MIN",&local_fad);
      ::std::__cxx11::string::string(local_9e0,"FLT_DIG",&local_fae);
      ::std::__cxx11::string::string(local_9c0,"FLT_MANT_DIG",&local_faf);
      ::std::__cxx11::string::string(local_9a0,"FLT_MAX_10_EXP",&local_fb0);
      ::std::__cxx11::string::string(local_980,"FLT_MAX_EXP",&local_fb1);
      ::std::__cxx11::string::string(local_960,"FLT_MIN_10_EXP",&local_fb2);
      ::std::__cxx11::string::string(local_940,"FLT_MIN_EXP",&local_fb3);
      ::std::__cxx11::string::string(local_920,"FLT_RADIX",&local_fb4);
      ::std::__cxx11::string::string(local_900,"FLT_MAX",&local_fb5);
      ::std::__cxx11::string::string(local_8e0,"FLT_MIN",&local_fb6);
      ::std::__cxx11::string::string(local_8c0,"FLT_EPSILON",&local_fb7);
      ::std::__cxx11::string::string(local_8a0,"FP_ILOGB0",&local_fb8);
      ::std::__cxx11::string::string(local_880,"FP_ILOGBNAN",&local_fb9);
      ::std::__cxx11::string::string(local_860,"MAXFLOAT",&local_fba);
      ::std::__cxx11::string::string(local_840,"HUGE_VALF",&local_fbb);
      ::std::__cxx11::string::string(local_820,"INFINITY",&local_fbc);
      ::std::__cxx11::string::string(local_800,"NAN",&local_fbd);
      ::std::__cxx11::string::string(local_7e0,"M_E_F",&local_fbe);
      ::std::__cxx11::string::string(local_7c0,"M_LOG2E_F",&local_fbf);
      ::std::__cxx11::string::string(local_7a0,"M_LOG10E_F",&local_fc0);
      ::std::__cxx11::string::string(local_780,"M_LN2_F",&local_fc1);
      ::std::__cxx11::string::string(local_760,"M_LN10_F",&local_fc2);
      ::std::__cxx11::string::string(local_740,"M_PI_F",&local_fc3);
      ::std::__cxx11::string::string(local_720,"M_PI_2_F",&local_fc4);
      ::std::__cxx11::string::string(local_700,"M_PI_4_F",&local_fc5);
      ::std::__cxx11::string::string(local_6e0,"M_1_PI_F",&local_fc6);
      ::std::__cxx11::string::string(local_6c0,"M_2_PI_F",&local_fc7);
      ::std::__cxx11::string::string(local_6a0,"M_2_SQRTPI_F",&local_fc8);
      ::std::__cxx11::string::string(local_680,"M_SQRT2_F",&local_fc9);
      ::std::__cxx11::string::string(local_660,"M_SQRT1_2_F",&local_fca);
      ::std::__cxx11::string::string(local_640,"HALF_DIG",&local_fcb);
      ::std::__cxx11::string::string(local_620,"HALF_MANT_DIG",&local_fcc);
      ::std::__cxx11::string::string(local_600,"HALF_MAX_10_EXP",&local_fcd);
      ::std::__cxx11::string::string(local_5e0,"HALF_MAX_EXP",&local_fce);
      ::std::__cxx11::string::string(local_5c0,"HALF_MIN_10_EXP",&local_fcf);
      ::std::__cxx11::string::string(local_5a0,"HALF_MIN_EXP",&local_fd0);
      ::std::__cxx11::string::string(local_580,"HALF_RADIX",&local_fd1);
      ::std::__cxx11::string::string(local_560,"HALF_MAX",&local_fd2);
      ::std::__cxx11::string::string(local_540,"HALF_MIN",&local_fd3);
      ::std::__cxx11::string::string(local_520,"HALF_EPSILON",&local_fd4);
      ::std::__cxx11::string::string(local_500,"MAXHALF",&local_fd5);
      ::std::__cxx11::string::string(local_4e0,"HUGE_VALH",&local_fd6);
      ::std::__cxx11::string::string(local_4c0,"M_E_H",&local_fd7);
      ::std::__cxx11::string::string(local_4a0,"M_LOG2E_H",&local_fd8);
      ::std::__cxx11::string::string(local_480,"M_LOG10E_H",&local_fd9);
      ::std::__cxx11::string::string(local_460,"M_LN2_H",&local_fda);
      ::std::__cxx11::string::string(local_440,"M_LN10_H",&local_fdb);
      ::std::__cxx11::string::string(local_420,"M_PI_H",&local_fdc);
      ::std::__cxx11::string::string(local_400,"M_PI_2_H",&local_fdd);
      ::std::__cxx11::string::string(local_3e0,"M_PI_4_H",&local_fde);
      ::std::__cxx11::string::string(local_3c0,"M_1_PI_H",&local_fdf);
      ::std::__cxx11::string::string(local_3a0,"M_2_PI_H",&local_fe0);
      ::std::__cxx11::string::string(local_380,"M_2_SQRTPI_H",&local_fe1);
      ::std::__cxx11::string::string(local_360,"M_SQRT2_H",&local_fe2);
      ::std::__cxx11::string::string(local_340,"M_SQRT1_2_H",&local_fe3);
      ::std::__cxx11::string::string(local_320,"DBL_DIG",&local_fe4);
      ::std::__cxx11::string::string(local_300,"DBL_MANT_DIG",&local_fe5);
      ::std::__cxx11::string::string(local_2e0,"DBL_MAX_10_EXP",&local_fe6);
      ::std::__cxx11::string::string(local_2c0,"DBL_MAX_EXP",&local_fe7);
      ::std::__cxx11::string::string(local_2a0,"DBL_MIN_10_EXP",&local_fe8);
      ::std::__cxx11::string::string(local_280,"DBL_MIN_EXP",&local_fe9);
      ::std::__cxx11::string::string(local_260,"DBL_RADIX",&local_fea);
      ::std::__cxx11::string::string(local_240,"DBL_MAX",&local_feb);
      ::std::__cxx11::string::string(local_220,"DBL_MIN",&local_fec);
      ::std::__cxx11::string::string(local_200,"DBL_EPSILON",&local_fed);
      ::std::__cxx11::string::string(local_1e0,"HUGE_VAL",&local_fee);
      ::std::__cxx11::string::string(local_1c0,"M_E",&local_fef);
      ::std::__cxx11::string::string(local_1a0,"M_LOG2E",&local_ff0);
      ::std::__cxx11::string::string(local_180,"M_LOG10E",&local_ff1);
      ::std::__cxx11::string::string(local_160,"M_LN2",&local_ff2);
      ::std::__cxx11::string::string(local_140,"M_LN10",&local_ff3);
      ::std::__cxx11::string::string(local_120,"M_PI",&local_ff4);
      ::std::__cxx11::string::string(local_100,"M_PI_2",&local_ff5);
      ::std::__cxx11::string::string(local_e0,"M_PI_4",&local_ff6);
      ::std::__cxx11::string::string(local_c0,"M_1_PI",&local_ff7);
      ::std::__cxx11::string::string(local_a0,"M_2_PI",&local_ff8);
      ::std::__cxx11::string::string(local_80,"M_2_SQRTPI",&local_ff9);
      ::std::__cxx11::string::string(local_60,"M_SQRT2",&local_ffa);
      ::std::__cxx11::string::string(local_40,"M_SQRT1_2",&local_ffb);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,local_f80,
                 &stack0xffffffffffffffe0,0,&local_ffc,&local_ffd,&local_ffe);
      lVar2 = 0xf40;
      do {
        ::std::__cxx11::string::~string(local_f80 + lVar2);
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}